

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::untrailToPos(SAT *this,vec<Lit> *t,int p)

{
  uint x;
  ulong uVar1;
  
  uVar1 = (ulong)t->sz;
  while (p < (int)uVar1) {
    uVar1 = (ulong)((int)uVar1 - 1);
    x = t->data[uVar1].x >> 1;
    (this->assigns).data[x] = ::l_Undef.value;
    insertVarOrder(this,x);
  }
  t->sz = p;
  return;
}

Assistant:

inline void SAT::untrailToPos(vec<Lit>& t, int p) {
	for (int i = t.size(); i-- > p;) {
		const int x = var(t[i]);
		assigns[x] = toInt(l_Undef);
#if PHASE_SAVING
		if (so.phase_saving >= 1 || (so.phase_saving == 1 && dl >= l0)) polarity[x] = sign(t[i]);
#endif
		insertVarOrder(x);
	}
	t.resize(p);
}